

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::TextFormat::Finder::FindExtension(Finder *this,Message *message,string *name)

{
  FieldDescriptor *pFVar1;
  Metadata MVar2;
  string_view printable_name;
  
  MVar2 = Message::GetMetadata(message);
  printable_name._M_str = (name->_M_dataplus)._M_p;
  printable_name._M_len = name->_M_string_length;
  pFVar1 = DescriptorPool::FindExtensionByPrintableName
                     ((MVar2.descriptor)->file_->pool_,MVar2.descriptor,printable_name);
  return pFVar1;
}

Assistant:

const FieldDescriptor* TextFormat::Finder::FindExtension(
    Message* message, const std::string& name) const {
  return DefaultFinderFindExtension(message, name);
}